

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int SaveEXRToMemory(float *data,int width,int height,int components,int save_as_fp16,uchar **outbuf,
                   char **err)

{
  size_t __size;
  ostream *poVar1;
  EXRChannelInfo *__dest;
  long lVar2;
  int *piVar3;
  size_type sVar4;
  int iVar5;
  float *pfVar6;
  size_type __new_size;
  size_t sStack_290;
  float *image_ptr [4];
  vector<float,_std::allocator<float>_> images [4];
  uchar *mem_buf;
  EXRImage image;
  stringstream ss;
  ostream local_1a8 [88];
  EXRChannelInfo *local_150;
  int *local_148;
  int local_140;
  int local_13c;
  int *local_138;
  
  if (((uint)components < 5) && ((0x1aU >> (components & 0x1fU) & 1) != 0)) {
    memset(&ss,0,0x188);
    local_13c = 3;
    if (width < 0x10) {
      local_13c = (uint)(0xf < height) * 3;
    }
    image.width = 0;
    image.height = 0;
    image.level_x = 0;
    image.level_y = 0;
    image.images = (uchar **)0x0;
    image.tiles = (EXRTile *)0x0;
    image.next_level = (TEXRImage *)0x0;
    image.num_tiles = 0;
    image.num_channels = components;
    images[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    images[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    images[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __new_size = (size_type)(height * width);
    if (components == 1) {
      std::vector<float,_std::allocator<float>_>::resize(images,__new_size);
      memcpy(images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,data,__new_size << 2);
      image_ptr[2] = (float *)0x0;
      image_ptr[3] = (float *)0x0;
      image_ptr[0] = (float *)0x0;
      image_ptr[1] = (float *)0x0;
      image_ptr[0] = std::vector<float,_std::allocator<float>_>::at(images,0);
    }
    else {
      std::vector<float,_std::allocator<float>_>::resize(images,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(images + 1,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(images + 2,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(images + 3,__new_size);
      pfVar6 = data + 3;
      for (sVar4 = 0; __new_size != sVar4; sVar4 = sVar4 + 1) {
        images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar4] = pfVar6[-3];
        images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar4] = pfVar6[-2];
        images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar4] = pfVar6[-1];
        if (components == 4) {
          images[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[sVar4] = *pfVar6;
        }
        pfVar6 = pfVar6 + (uint)components;
      }
      image_ptr[2] = (float *)0x0;
      image_ptr[3] = (float *)0x0;
      image_ptr[0] = (float *)0x0;
      image_ptr[1] = (float *)0x0;
      if (components == 4) {
        image_ptr[0] = std::vector<float,_std::allocator<float>_>::at(images + 3,0);
        image_ptr[1] = std::vector<float,_std::allocator<float>_>::at(images + 2,0);
        image_ptr[2] = std::vector<float,_std::allocator<float>_>::at(images + 1,0);
        image_ptr[3] = std::vector<float,_std::allocator<float>_>::at(images,0);
      }
      else if (components == 3) {
        image_ptr[0] = std::vector<float,_std::allocator<float>_>::at(images + 2,0);
        image_ptr[1] = std::vector<float,_std::allocator<float>_>::at(images + 1,0);
        image_ptr[2] = std::vector<float,_std::allocator<float>_>::at(images,0);
      }
    }
    image.images = (uchar **)image_ptr;
    image.height = height;
    image.width = width;
    local_140 = components;
    __dest = (EXRChannelInfo *)malloc((ulong)(uint)(components * 0x110));
    local_150 = __dest;
    if (components == 4) {
      strncpy((char *)__dest,"A",0xff);
      strncpy(__dest[1].name,"B",0xff);
      strncpy(__dest[2].name,"G",0xff);
      strncpy(__dest[3].name,"R",0xff);
      __dest->name[1] = '\0';
      __dest[1].name[1] = '\0';
      __dest[2].name[1] = '\0';
      lVar2 = 0x331;
    }
    else if (components == 3) {
      strncpy((char *)__dest,"B",0xff);
      strncpy(__dest[1].name,"G",0xff);
      strncpy(__dest[2].name,"R",0xff);
      __dest->name[1] = '\0';
      __dest[1].name[1] = '\0';
      lVar2 = 0x221;
    }
    else {
      strncpy((char *)__dest,"A",0xff);
      lVar2 = 1;
    }
    __dest->name[lVar2] = '\0';
    __size = (long)components * 4;
    piVar3 = (int *)malloc(__size);
    local_148 = piVar3;
    local_138 = (int *)malloc(__size);
    for (lVar2 = 0; lVar2 < components; lVar2 = lVar2 + 1) {
      piVar3[lVar2] = 2;
      local_138[lVar2] = (save_as_fp16 < 1) + 1;
    }
    sStack_290 = SaveEXRImageToMemory(&image,(EXRHeader *)&ss,&mem_buf,err);
    if (sStack_290 == 0) {
      sStack_290 = 0xfffffffffffffff4;
    }
    else {
      free(local_150);
      free(local_148);
      free(local_138);
      if (sStack_290 >> 0x1f == 0) {
        *outbuf = mem_buf;
      }
      else {
        free(mem_buf);
        sStack_290 = 0xfffffffffffffff2;
      }
    }
    iVar5 = (int)sStack_290;
    lVar2 = 0x48;
    do {
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)
                 ((long)&images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != -0x18);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar1 = std::operator<<(local_1a8,"Unsupported component value : ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,components);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::stringbuf::str();
    tinyexr::SetErrorMessage((string *)images,err);
    std::__cxx11::string::~string((string *)images);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    iVar5 = -3;
  }
  return iVar5;
}

Assistant:

int SaveEXRToMemory(const float *data, int width, int height, int components,
            const int save_as_fp16, const unsigned char **outbuf, const char **err) {

  if ((components == 1) || components == 3 || components == 4) {
    // OK
  } else {
    std::stringstream ss;
    ss << "Unsupported component value : " << components << std::endl;

    tinyexr::SetErrorMessage(ss.str(), err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRHeader header;
  InitEXRHeader(&header);

  if ((width < 16) && (height < 16)) {
    // No compression for small image.
    header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;
  } else {
    header.compression_type = TINYEXR_COMPRESSIONTYPE_ZIP;
  }

  EXRImage image;
  InitEXRImage(&image);

  image.num_channels = components;

  std::vector<float> images[4];

  if (components == 1) {
    images[0].resize(static_cast<size_t>(width * height));
    memcpy(images[0].data(), data, sizeof(float) * size_t(width * height));
  } else {
    images[0].resize(static_cast<size_t>(width * height));
    images[1].resize(static_cast<size_t>(width * height));
    images[2].resize(static_cast<size_t>(width * height));
    images[3].resize(static_cast<size_t>(width * height));

    // Split RGB(A)RGB(A)RGB(A)... into R, G and B(and A) layers
    for (size_t i = 0; i < static_cast<size_t>(width * height); i++) {
      images[0][i] = data[static_cast<size_t>(components) * i + 0];
      images[1][i] = data[static_cast<size_t>(components) * i + 1];
      images[2][i] = data[static_cast<size_t>(components) * i + 2];
      if (components == 4) {
        images[3][i] = data[static_cast<size_t>(components) * i + 3];
      }
    }
  }

  float *image_ptr[4] = {0, 0, 0, 0};
  if (components == 4) {
    image_ptr[0] = &(images[3].at(0));  // A
    image_ptr[1] = &(images[2].at(0));  // B
    image_ptr[2] = &(images[1].at(0));  // G
    image_ptr[3] = &(images[0].at(0));  // R
  } else if (components == 3) {
    image_ptr[0] = &(images[2].at(0));  // B
    image_ptr[1] = &(images[1].at(0));  // G
    image_ptr[2] = &(images[0].at(0));  // R
  } else if (components == 1) {
    image_ptr[0] = &(images[0].at(0));  // A
  }

  image.images = reinterpret_cast<unsigned char **>(image_ptr);
  image.width = width;
  image.height = height;

  header.num_channels = components;
  header.channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(header.num_channels)));
  // Must be (A)BGR order, since most of EXR viewers expect this channel order.
  if (components == 4) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
    strncpy_s(header.channels[1].name, "B", 255);
    strncpy_s(header.channels[2].name, "G", 255);
    strncpy_s(header.channels[3].name, "R", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
    strncpy(header.channels[1].name, "B", 255);
    strncpy(header.channels[2].name, "G", 255);
    strncpy(header.channels[3].name, "R", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
    header.channels[1].name[strlen("B")] = '\0';
    header.channels[2].name[strlen("G")] = '\0';
    header.channels[3].name[strlen("R")] = '\0';
  } else if (components == 3) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "B", 255);
    strncpy_s(header.channels[1].name, "G", 255);
    strncpy_s(header.channels[2].name, "R", 255);
#else
    strncpy(header.channels[0].name, "B", 255);
    strncpy(header.channels[1].name, "G", 255);
    strncpy(header.channels[2].name, "R", 255);
#endif
    header.channels[0].name[strlen("B")] = '\0';
    header.channels[1].name[strlen("G")] = '\0';
    header.channels[2].name[strlen("R")] = '\0';
  } else {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
  }

  header.pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  header.requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  for (int i = 0; i < header.num_channels; i++) {
    header.pixel_types[i] =
        TINYEXR_PIXELTYPE_FLOAT;  // pixel type of input image

    if (save_as_fp16 > 0) {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_HALF;  // save with half(fp16) pixel format
    } else {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_FLOAT;  // save with float(fp32) pixel format(i.e.
                                    // no precision reduction)
    }
  }


  unsigned char *mem_buf;
  size_t mem_size = SaveEXRImageToMemory(&image, &header, &mem_buf, err);

  if (mem_size == 0) {
    return TINYEXR_ERROR_SERIALIZATION_FAILED;
  }

  free(header.channels);
  free(header.pixel_types);
  free(header.requested_pixel_types);

  if (mem_size > size_t(std::numeric_limits<int>::max())) {
    free(mem_buf);
    return TINYEXR_ERROR_DATA_TOO_LARGE;
  }

  (*outbuf) = mem_buf;

  return int(mem_size);
}